

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElementTable.h
# Opt level: O0

FloatingConstant * __thiscall
psy::TextElementTable<psy::C::FloatingConstant>::findOrInsert
          (TextElementTable<psy::C::FloatingConstant> *this,char *chars,uint size)

{
  int iVar1;
  uint uVar2;
  FloatingConstant **ppFVar3;
  uint h;
  FloatingConstant *elem;
  uint size_local;
  char *chars_local;
  TextElementTable<psy::C::FloatingConstant> *this_local;
  
  this_local = (TextElementTable<psy::C::FloatingConstant> *)find(this,chars,size);
  if (this_local == (TextElementTable<psy::C::FloatingConstant> *)0x0) {
    iVar1 = this->count_ + 1;
    this->count_ = iVar1;
    if (iVar1 == this->allocated_) {
      if (this->allocated_ == 0) {
        this->allocated_ = 4;
      }
      else {
        this->allocated_ = this->allocated_ << 1;
      }
      ppFVar3 = (FloatingConstant **)realloc(this->elements_,(long)this->allocated_ << 3);
      this->elements_ = ppFVar3;
    }
    this_local = (TextElementTable<psy::C::FloatingConstant> *)operator_new(0x30);
    C::FloatingConstant::FloatingConstant((FloatingConstant *)this_local,chars,size);
    this->elements_[this->count_] = (FloatingConstant *)this_local;
    if ((this->buckets_ == (FloatingConstant **)0x0) ||
       (iVar1 = this->count_ * 5,
       SBORROW4(iVar1,this->bucketCount_ * 3) == iVar1 + this->bucketCount_ * -3 < 0)) {
      rehash(this);
    }
    else {
      uVar2 = TextElement::hashCode((TextElement *)this_local);
      uVar2 = uVar2 % (uint)this->bucketCount_;
      this_local[1].elements_ = (FloatingConstant **)this->buckets_[uVar2];
      this->buckets_[uVar2] = (FloatingConstant *)this_local;
    }
  }
  return (FloatingConstant *)this_local;
}

Assistant:

const ElemT* findOrInsert(const char *chars, unsigned int size)
    {
        ElemT* elem = const_cast<ElemT*>(find(chars, size));
        if (elem)
            return elem;

        if (++count_ == allocated_) {
            if (!allocated_)
                allocated_ = 4;
            else
                allocated_ <<= 1;
            elements_ = (ElemT**) std::realloc(elements_, sizeof(ElemT*)* allocated_);
        }

        elem = new ElemT(chars, size);
        elements_[count_] = elem;

        if (!buckets_ || count_ * 5 >= bucketCount_ * 3)
            rehash();
        else {
            unsigned h = elem->hashCode() % bucketCount_;
            elem ->next_ = buckets_[h];
            buckets_[h] = elem;
        }

        return elem;
    }